

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestMultiProcessHandler.cxx
# Opt level: O2

bool __thiscall cmCTestMultiProcessHandler::StartTest(cmCTestMultiProcessHandler *this,int test)

{
  cmCTestMultiProcessHandler *this_00;
  bool bVar1;
  mapped_type *ppcVar2;
  iterator iVar3;
  _Base_ptr p_Var4;
  mapped_type *pmVar5;
  int local_3c;
  cmCTestMultiProcessHandler *local_38;
  
  local_3c = test;
  ppcVar2 = std::
            map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
            ::operator[](&(this->Properties).
                          super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                         ,&local_3c);
  p_Var4 = ((*ppcVar2)->LockedResources)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  local_38 = this;
  while( true ) {
    ppcVar2 = std::
              map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
              ::operator[](&(this->Properties).
                            super_map<int,_cmCTestTestHandler::cmCTestTestProperties_*,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestTestHandler::cmCTestTestProperties_*>_>_>
                           ,&local_3c);
    this_00 = local_38;
    if ((_Rb_tree_header *)p_Var4 ==
        &((*ppcVar2)->LockedResources)._M_t._M_impl.super__Rb_tree_header) break;
    iVar3 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::find(&(this->LockedResources)._M_t,(key_type *)(p_Var4 + 1));
    if ((_Rb_tree_header *)iVar3._M_node !=
        &(this->LockedResources)._M_t._M_impl.super__Rb_tree_header) goto LAB_003441da;
    p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4);
  }
  pmVar5 = std::
           map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
           ::operator[](&(local_38->Tests).
                         super_map<int,_cmCTestMultiProcessHandler::TestSet,_std::less<int>,_std::allocator<std::pair<const_int,_cmCTestMultiProcessHandler::TestSet>_>_>
                        ,&local_3c);
  if ((pmVar5->super_set<int,_std::less<int>,_std::allocator<int>_>)._M_t._M_impl.
      super__Rb_tree_header._M_node_count == 0) {
    StartTestProcess(this_00,local_3c);
    bVar1 = true;
  }
  else {
LAB_003441da:
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool cmCTestMultiProcessHandler::StartTest(int test)
{
  // Check for locked resources
  for (std::set<std::string>::iterator i =
         this->Properties[test]->LockedResources.begin();
       i != this->Properties[test]->LockedResources.end(); ++i) {
    if (this->LockedResources.find(*i) != this->LockedResources.end()) {
      return false;
    }
  }

  // if there are no depends left then run this test
  if (this->Tests[test].empty()) {
    this->StartTestProcess(test);
    return true;
  }
  // This test was not able to start because it is waiting
  // on depends to run
  return false;
}